

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# import_debug_line_section.hpp
# Opt level: O3

void __thiscall
pstore::exchange::import_ns::
debug_line_section<std::back_insert_iterator<std::vector<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>,_std::allocator<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>_>_>_>_>
::~debug_line_section
          (debug_line_section<std::back_insert_iterator<std::vector<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>,_std::allocator<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>_>_>_>_>
           *this)

{
  ~debug_line_section(this);
  operator_delete(this,0x90);
  return;
}

Assistant:

~debug_line_section () noexcept override = default;